

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

void __thiscall soul::HTMLGenerator::printModule(HTMLGenerator *this,HTMLElement *parent,Module *m)

{
  HTMLElement *this_00;
  HTMLElement *pHVar1;
  char *in_R8;
  string_view sVar2;
  string_view local_100;
  HTMLElement *local_f0;
  HTMLElement *sections;
  char *local_e0;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98 [2];
  allocator<char> local_71;
  string local_70;
  HTMLElement *local_50;
  HTMLElement *title;
  char *local_40;
  string_view local_38;
  HTMLElement *local_28;
  HTMLElement *moduleDiv;
  Module *m_local;
  HTMLElement *parent_local;
  HTMLGenerator *this_local;
  
  moduleDiv = (HTMLElement *)m;
  m_local = (Module *)parent;
  parent_local = (HTMLElement *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"module");
  pHVar1 = choc::html::HTMLElement::addDiv(parent,local_38);
  sVar2 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(moduleDiv->name)._M_string_length);
  local_40 = sVar2._M_str;
  title = (HTMLElement *)sVar2._M_len;
  pHVar1 = choc::html::HTMLElement::setID(pHVar1,sVar2);
  local_28 = pHVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"h2",&local_71);
  pHVar1 = choc::html::HTMLElement::addChild(pHVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  local_50 = pHVar1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_98,"module_type");
  pHVar1 = choc::html::HTMLElement::addSpan(pHVar1,local_98[0]);
  local_a8 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&moduleDiv->properties);
  pHVar1 = choc::html::HTMLElement::addContent(pHVar1,local_a8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8," ");
  choc::html::HTMLElement::addContent(pHVar1,local_b8);
  pHVar1 = local_50;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"module_name");
  pHVar1 = choc::html::HTMLElement::addSpan(pHVar1,local_c8);
  local_d8 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)
                        &(moduleDiv->children).
                         super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  choc::html::HTMLElement::addContent(pHVar1,local_d8);
  this_00 = local_28;
  pHVar1 = moduleDiv + 1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&sections,"summary");
  sVar2._M_str = in_R8;
  sVar2._M_len = (size_t)local_e0;
  addComment((HTMLGenerator *)this_00,(HTMLElement *)&(pHVar1->name).field_2,(Comment *)sections,
             sVar2);
  pHVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_100,"module_sections");
  local_f0 = choc::html::HTMLElement::addDiv(pHVar1,local_100);
  printAnnotation(this,local_f0,
                  (Annotation *)
                  &moduleDiv[1].children.
                   super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  printSpecialisationParams(this,local_f0,(Module *)moduleDiv);
  printEndpoints(this,local_f0,(Module *)moduleDiv);
  printStructs(this,local_f0,(Module *)moduleDiv);
  printFunctions(this,local_f0,(Module *)moduleDiv);
  printVariables(this,local_f0,(Module *)moduleDiv);
  printProcessorInstances(this,local_f0,(Module *)moduleDiv);
  printConnections(this,local_f0,(Module *)moduleDiv);
  return;
}

Assistant:

void printModule (choc::html::HTMLElement& parent, const SourceCodeModel::Module& m)
    {
        auto& moduleDiv = parent.addDiv ("module").setID (m.UID);

        auto& title = moduleDiv.addChild ("h2");
        title.addSpan ("module_type").addContent (m.moduleTypeDescription).addContent (" ");
        title.addSpan ("module_name").addContent (m.fullyQualifiedName);

        addComment (moduleDiv, m.comment, "summary");

        auto& sections = moduleDiv.addDiv ("module_sections");
        printAnnotation (sections, m.annotation);
        printSpecialisationParams (sections, m);
        printEndpoints (sections, m);
        printStructs (sections, m);
        printFunctions (sections, m);
        printVariables (sections, m);
        printProcessorInstances (sections, m);
        printConnections (sections, m);
    }